

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagelayout.cpp
# Opt level: O1

void __thiscall QPageLayout::setUnits(QPageLayout *this,Unit units)

{
  QPageLayoutPrivate *pQVar1;
  long in_FS_OFFSET;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  QSizeF QVar6;
  QMarginsF local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if (pQVar1->m_units != units) {
    if ((pQVar1 != (QPageLayoutPrivate *)0x0) &&
       ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1)) {
      QExplicitlySharedDataPointer<QPageLayoutPrivate>::detach_helper(&this->d);
    }
    pQVar1 = (this->d).d.ptr;
    qt_convertMargins(&local_48,&pQVar1->m_margins,pQVar1->m_units,units);
    (pQVar1->m_margins).m_right = local_48.m_right;
    (pQVar1->m_margins).m_bottom = local_48.m_bottom;
    (pQVar1->m_margins).m_left = local_48.m_left;
    (pQVar1->m_margins).m_top = local_48.m_top;
    pQVar1 = (this->d).d.ptr;
    qt_convertMargins(&local_48,&pQVar1->m_minMargins,pQVar1->m_units,units);
    (pQVar1->m_minMargins).m_right = local_48.m_right;
    (pQVar1->m_minMargins).m_bottom = local_48.m_bottom;
    (pQVar1->m_minMargins).m_left = local_48.m_left;
    (pQVar1->m_minMargins).m_top = local_48.m_top;
    pQVar1 = (this->d).d.ptr;
    qt_convertMargins(&local_48,&pQVar1->m_maxMargins,pQVar1->m_units,units);
    (pQVar1->m_maxMargins).m_right = local_48.m_right;
    (pQVar1->m_maxMargins).m_bottom = local_48.m_bottom;
    (pQVar1->m_maxMargins).m_left = local_48.m_left;
    (pQVar1->m_maxMargins).m_top = local_48.m_top;
    pQVar1 = (this->d).d.ptr;
    pQVar1->m_units = units;
    QVar6 = QPageSize::size(&pQVar1->m_pageSize,units);
    uVar2 = QVar6.ht._0_4_;
    uVar4 = QVar6.ht._4_4_;
    uVar3 = QVar6.wd._0_4_;
    uVar5 = QVar6.wd._4_4_;
    if (pQVar1->m_orientation != Landscape) {
      uVar3 = uVar2;
      uVar5 = uVar4;
      uVar2 = QVar6.wd._0_4_;
      uVar4 = QVar6.wd._4_4_;
    }
    pQVar1 = (this->d).d.ptr;
    (pQVar1->m_fullSize).wd = (qreal)CONCAT44(uVar4,uVar2);
    (pQVar1->m_fullSize).ht = (qreal)CONCAT44(uVar5,uVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPageLayout::setUnits(Unit units)
{
    if (units != d->m_units) {
        d.detach();
        d->m_margins = qt_convertMargins(d->m_margins, d->m_units, units);
        d->m_minMargins = qt_convertMargins(d->m_minMargins, d->m_units, units);
        d->m_maxMargins = qt_convertMargins(d->m_maxMargins, d->m_units, units);
        d->m_units = units;
        d->m_fullSize = d->fullSizeUnits(d->m_units);
    }
}